

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::PostprocessHelper_SplitFacesByTextureID
          (AMFImporter *this,
          list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
          *pInputList,
          list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
          *pOutputList_Separated)

{
  CAMFImporter_NodeElement_TexMap *pCVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  const_iterator __position;
  list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
  face_list_cur;
  SComplexFace face_start;
  _List_node_base local_68;
  undefined8 local_58;
  SComplexFace local_50;
  
  std::__cxx11::
  list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
  ::clear(pOutputList_Separated);
  p_Var3 = (pInputList->
           super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 == (_List_node_base *)pInputList) {
    return;
  }
  do {
    SComplexFace::SComplexFace(&local_50,(SComplexFace *)(p_Var3 + 1));
    local_58 = 0;
    __position._M_node =
         (pInputList->
         super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
         )._M_impl._M_node.super__List_node_base._M_next;
    local_68._M_next = &local_68;
    local_68._M_prev = &local_68;
    while (pCVar1 = local_50.TexMap, __position._M_node != (_List_node_base *)pInputList) {
      p_Var3 = __position._M_node[2]._M_prev;
      if (p_Var3 == (_List_node_base *)0x0 ||
          local_50.TexMap == (CAMFImporter_NodeElement_TexMap *)0x0) {
        if (local_50.TexMap != (CAMFImporter_NodeElement_TexMap *)0x0 ||
            p_Var3 != (_List_node_base *)0x0) goto LAB_003ca280;
LAB_003ca20e:
        p_Var3 = (__position._M_node)->_M_next;
        std::__cxx11::
        list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
        ::push_back((list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                     *)&local_68,(value_type *)(__position._M_node + 1));
        std::__cxx11::
        list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
        ::erase(pInputList,__position);
        __position._M_node = p_Var3;
      }
      else {
        bVar2 = std::operator!=(&(local_50.TexMap)->TextureID_R,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p_Var3[7]._M_prev);
        if ((((!bVar2) &&
             (bVar2 = std::operator!=(&pCVar1->TextureID_G,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p_Var3[9]._M_prev), !bVar2)) &&
            (bVar2 = std::operator!=(&pCVar1->TextureID_B,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&p_Var3[0xb]._M_prev), !bVar2)) &&
           (bVar2 = std::operator!=(&pCVar1->TextureID_A,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&p_Var3[0xd]._M_prev), !bVar2)) goto LAB_003ca20e;
LAB_003ca280:
        __position._M_node = (__position._M_node)->_M_next;
      }
    }
    if (local_68._M_next != &local_68) {
      std::__cxx11::
      list<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>,_std::allocator<std::__cxx11::list<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>_>_>
      ::push_back(pOutputList_Separated,(value_type *)&local_68);
    }
    std::__cxx11::
    _List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
    ::_M_clear((_List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
                *)&local_68);
    aiFace::~aiFace(&local_50.Face);
    p_Var3 = (pInputList->
             super__List_base<Assimp::AMFImporter::SComplexFace,_std::allocator<Assimp::AMFImporter::SComplexFace>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)pInputList) {
      return;
    }
  } while( true );
}

Assistant:

void AMFImporter::PostprocessHelper_SplitFacesByTextureID(std::list<SComplexFace>& pInputList, std::list<std::list<SComplexFace> >& pOutputList_Separated)
{
    auto texmap_is_equal = [](const CAMFImporter_NodeElement_TexMap* pTexMap1, const CAMFImporter_NodeElement_TexMap* pTexMap2) -> bool
    {
	    if((pTexMap1 == nullptr) && (pTexMap2 == nullptr)) return true;
	    if(pTexMap1 == nullptr) return false;
	    if(pTexMap2 == nullptr) return false;

	    if(pTexMap1->TextureID_R != pTexMap2->TextureID_R) return false;
	    if(pTexMap1->TextureID_G != pTexMap2->TextureID_G) return false;
	    if(pTexMap1->TextureID_B != pTexMap2->TextureID_B) return false;
	    if(pTexMap1->TextureID_A != pTexMap2->TextureID_A) return false;

	    return true;
    };

	pOutputList_Separated.clear();
	if(pInputList.empty()) return;

	do
	{
		SComplexFace face_start = pInputList.front();
		std::list<SComplexFace> face_list_cur;

		for(std::list<SComplexFace>::iterator it = pInputList.begin(), it_end = pInputList.end(); it != it_end;)
		{
			if(texmap_is_equal(face_start.TexMap, it->TexMap))
			{
				auto it_old = it;

				++it;
				face_list_cur.push_back(*it_old);
				pInputList.erase(it_old);
			}
			else
			{
				++it;
			}
		}

		if(!face_list_cur.empty()) pOutputList_Separated.push_back(face_list_cur);

	} while(!pInputList.empty());
}